

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::UpdateElapsedTime(cmCTestScriptHandler *this)

{
  string_view value;
  bool bVar1;
  pointer this_00;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string timeString;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<double,std::ratio<1l,1l>> local_20 [12];
  uint local_14;
  cmCTestScriptHandler *pcStack_10;
  uint itime;
  cmCTestScriptHandler *this_local;
  
  pcStack_10 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Makefile);
  if (bVar1) {
    timeString.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
    local_28.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)((long)&timeString.field_2 + 8),&this->ScriptStartTime);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              (local_20,&local_28);
    local_14 = cmDurationTo<unsigned_int>((cmDuration *)local_20);
    std::__cxx11::to_string((string *)local_50,local_14);
    this_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                        (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CTEST_ELAPSED_TIME",&local_71);
    value = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    cmMakefile::AddDefinition(this_00,&local_70,value);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmCTestScriptHandler::UpdateElapsedTime()
{
  if (this->Makefile) {
    // set the current elapsed time
    auto itime = cmDurationTo<unsigned int>(std::chrono::steady_clock::now() -
                                            this->ScriptStartTime);
    auto timeString = std::to_string(itime);
    this->Makefile->AddDefinition("CTEST_ELAPSED_TIME", timeString);
  }
}